

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_KDReportsPreviewWidget.cpp
# Opt level: O0

void KDReports::PreviewWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  QMetaType QVar3;
  int *result;
  QMetaType local_48 [2];
  QMetaType local_38;
  QMetaType local_30;
  QObject *local_28;
  PreviewWidget *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (PreviewWidget *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      pageSizeChanged((PreviewWidget *)_o,(QPageSize *)_a[1]);
      break;
    case 1:
      orientationChanged((PreviewWidget *)_o,*_a[1]);
      break;
    case 2:
      tableSettingsClicked((PreviewWidget *)_o);
      break;
    case 3:
      linkActivated((PreviewWidget *)_o,(QUrl *)_a[1]);
    }
  }
  else if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 0) {
      if (*_a[1] == 0) {
        QVar3 = QMetaType::fromType<QPageSize>();
        **(undefined8 **)_t = QVar3.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)_t = local_38.d_ptr;
      }
    }
    else if (_id == 1) {
      if (*_a[1] == 0) {
        QVar3 = QMetaType::fromType<QPageLayout::Orientation>();
        **(undefined8 **)_t = QVar3.d_ptr;
      }
      else {
        memset(local_48,0,8);
        QMetaType::QMetaType(local_48);
        **(undefined8 **)_t = local_48[0].d_ptr;
      }
    }
    else {
      memset(&local_30,0,8);
      QMetaType::QMetaType(&local_30);
      **(undefined8 **)_t = local_30.d_ptr;
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == pageSizeChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == orientationChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)
         ) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == tableSettingsClicked &&
            (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
        else {
          pcVar2 = *_a[1];
          if (pcVar2 == linkActivated && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0))
          {
            *puVar1 = 3;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void KDReports::PreviewWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PreviewWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->pageSizeChanged((*reinterpret_cast< std::add_pointer_t<QPageSize>>(_a[1]))); break;
        case 1: _t->orientationChanged((*reinterpret_cast< std::add_pointer_t<QPageLayout::Orientation>>(_a[1]))); break;
        case 2: _t->tableSettingsClicked(); break;
        case 3: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QPageSize >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QPageLayout::Orientation >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PreviewWidget::*)(const QPageSize & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PreviewWidget::pageSizeChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (PreviewWidget::*)(QPageLayout::Orientation );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PreviewWidget::orientationChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (PreviewWidget::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PreviewWidget::tableSettingsClicked)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (PreviewWidget::*)(const QUrl & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PreviewWidget::linkActivated)) {
                *result = 3;
                return;
            }
        }
    }
}